

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_streams.c
# Opt level: O1

HPDF_Stream HPDF_CallbackWriter_New(HPDF_MMgr mmgr,HPDF_Stream_Write_Func write_fn,void *data)

{
  HPDF_Stream s;
  
  s = (HPDF_Stream)HPDF_GetMem(mmgr,0x58);
  if (s != (HPDF_Stream)0x0) {
    HPDF_MemSet(s,'\0',0x58);
    s->sig_bytes = 0x5354524d;
    s->error = mmgr->error;
    s->mmgr = mmgr;
    s->write_fn = write_fn;
    s->attr = data;
    s->type = HPDF_STREAM_CALLBACK;
  }
  return s;
}

Assistant:

HPDF_Stream
HPDF_CallbackWriter_New (HPDF_MMgr               mmgr,
                         HPDF_Stream_Write_Func  write_fn,
                         void*                   data)
{
    HPDF_Stream stream;

    HPDF_PTRACE((" HPDF_CallbackWriter_New\n"));

    stream = (HPDF_Stream)HPDF_GetMem (mmgr, sizeof(HPDF_Stream_Rec));

    if (stream) {
        HPDF_MemSet (stream, 0, sizeof(HPDF_Stream_Rec));
        stream->sig_bytes = HPDF_STREAM_SIG_BYTES;
        stream->error = mmgr->error;
        stream->mmgr = mmgr;
        stream->write_fn = write_fn;
        stream->attr = data;
        stream->type = HPDF_STREAM_CALLBACK;
    }

    return stream;
}